

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O0

void j2k_read_cod(opj_j2k_t *j2k)

{
  opj_cio_t *cio_00;
  long lVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  void *pvVar6;
  long in_RDI;
  opj_codestream_info_t *cstr_info;
  opj_image_t *image;
  opj_tcp_t *tcp;
  opj_cp_t *cp;
  opj_cio_t *cio;
  int pos;
  int i;
  int len;
  opj_cio_t *in_stack_ffffffffffffffc0;
  long lVar7;
  
  cio_00 = *(opj_cio_t **)(in_RDI + 0x70);
  if (*(int *)(in_RDI + 8) == 0x10) {
    lVar5 = *(long *)(*(long *)(in_RDI + 0x60) + 0x80) + (long)*(int *)(in_RDI + 0xc) * 0x15e8;
  }
  else {
    lVar5 = *(long *)(in_RDI + 0x50);
  }
  lVar1 = *(long *)(in_RDI + 0x58);
  iVar4 = (int)((ulong)lVar5 >> 0x20);
  uVar2 = cio_read(in_stack_ffffffffffffffc0,iVar4);
  uVar3 = cio_read(in_stack_ffffffffffffffc0,iVar4);
  *(uint *)(lVar5 + 4) = uVar3;
  uVar3 = cio_read(in_stack_ffffffffffffffc0,iVar4);
  *(uint *)(lVar5 + 8) = uVar3;
  uVar3 = cio_read(in_stack_ffffffffffffffc0,iVar4);
  *(uint *)(lVar5 + 0xc) = uVar3;
  uVar3 = cio_read(in_stack_ffffffffffffffc0,iVar4);
  *(uint *)(lVar5 + 0x10) = uVar3;
  iVar4 = cio_tell(cio_00);
  for (uVar3 = 0; uVar3 < *(uint *)(lVar1 + 0x10); uVar3 = uVar3 + 1) {
    *(uint *)(*(long *)(lVar5 + 0x15e0) + (long)(int)uVar3 * 0x438) = *(uint *)(lVar5 + 4) & 1;
    cio_seek(cio_00,iVar4);
    j2k_read_cox((opj_j2k_t *)CONCAT44(uVar2,uVar3),iVar4);
  }
  if (*(long *)(in_RDI + 0x68) != 0) {
    lVar7 = *(long *)(in_RDI + 0x68);
    *(undefined4 *)(lVar7 + 0x18) = *(undefined4 *)(lVar5 + 8);
    *(undefined4 *)(lVar7 + 0x38) = *(undefined4 *)(lVar5 + 0xc);
    pvVar6 = malloc((ulong)*(uint *)(lVar1 + 0x10) << 2);
    *(void **)(lVar7 + 0x40) = pvVar6;
    for (uVar2 = 0; uVar2 < *(uint *)(lVar1 + 0x10); uVar2 = uVar2 + 1) {
      *(int *)(*(long *)(lVar7 + 0x40) + (long)(int)uVar2 * 4) =
           *(int *)(*(long *)(lVar5 + 0x15e0) + (long)(int)uVar2 * 0x438 + 4) + -1;
    }
  }
  return;
}

Assistant:

static void j2k_read_cod(opj_j2k_t *j2k) {
	int len, i, pos;
	
	opj_cio_t *cio = j2k->cio;
	opj_cp_t *cp = j2k->cp;
	opj_tcp_t *tcp = j2k->state == J2K_STATE_TPH ? &cp->tcps[j2k->curtileno] : j2k->default_tcp;
	opj_image_t *image = j2k->image;
	
	len = cio_read(cio, 2);				/* Lcod */
	tcp->csty = cio_read(cio, 1);		/* Scod */
	tcp->prg = (OPJ_PROG_ORDER)cio_read(cio, 1);		/* SGcod (A) */
	tcp->numlayers = cio_read(cio, 2);	/* SGcod (B) */
	tcp->mct = cio_read(cio, 1);		/* SGcod (C) */
	
	pos = cio_tell(cio);
	for (i = 0; i < image->numcomps; i++) {
		tcp->tccps[i].csty = tcp->csty & J2K_CP_CSTY_PRT;
		cio_seek(cio, pos);
		j2k_read_cox(j2k, i);
	}

	/* Index */
	if (j2k->cstr_info) {
		opj_codestream_info_t *cstr_info = j2k->cstr_info;
		cstr_info->prog = tcp->prg;
		cstr_info->numlayers = tcp->numlayers;
		cstr_info->numdecompos = (int*) opj_malloc(image->numcomps * sizeof(int));
		for (i = 0; i < image->numcomps; i++) {
			cstr_info->numdecompos[i] = tcp->tccps[i].numresolutions - 1;
		}
	}
}